

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltools.hh
# Opt level: O3

unsigned_long anon_unknown.dwarf_18458::getAttribute<unsigned_long>(xmlNodePtr type,char *att_name)

{
  unsigned_long uVar1;
  bool bVar2;
  char *in_RCX;
  unsigned_long local_48;
  undefined **local_40;
  type_info_t *local_38;
  type_info_t *local_30;
  string local_28;
  
  (anonymous_namespace)::getStringAttribute_abi_cxx11_
            (&local_28,(_anonymous_namespace_ *)type,(xmlNodePtr)att_name,in_RCX);
  local_48 = 0;
  local_38 = (type_info_t *)(local_28._M_dataplus._M_p + local_28._M_string_length);
  local_40 = (undefined **)local_28._M_dataplus._M_p;
  bVar2 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
          shr_unsigned<unsigned_long>
                    ((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)&local_40,
                     &local_48);
  uVar1 = local_48;
  if (bVar2) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p);
    }
    return uVar1;
  }
  local_40 = &PTR__bad_cast_00113a90;
  local_38 = (type_info_t *)&std::__cxx11::string::typeinfo;
  local_30 = (type_info_t *)&unsigned_long::typeinfo;
  boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_40);
}

Assistant:

T getAttribute(xmlNodePtr type, char const* att_name)
    { return boost::lexical_cast<T>(getStringAttribute(type, att_name)); }